

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

Equality __thiscall capnp::AnyStruct::Reader::equals(Reader *this,Reader right)

{
  int *__return_storage_ptr__;
  Reader right_00;
  int iVar1;
  uint uVar2;
  Equality EVar3;
  uchar *puVar4;
  uchar *__s2;
  bool bVar5;
  bool local_18a;
  bool local_189;
  undefined1 auStack_148 [8];
  Reader r;
  Reader l;
  uint uStack_100;
  Equality eqResult;
  size_t i;
  ulong local_d8;
  size_t ptrsSizeR;
  Reader ptrsR;
  ulong local_80;
  size_t ptrsSizeL;
  Reader ptrsL;
  size_t dataSizeR;
  ArrayPtr<const_unsigned_char> dataR;
  size_t dataSizeL;
  ArrayPtr<const_unsigned_char> dataL;
  Reader *this_local;
  
  dataL.size_ = (size_t)this;
  _dataSizeL = getDataSection(this);
  dataR.size_ = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&dataSizeL)
  ;
  while( true ) {
    bVar5 = false;
    if (dataR.size_ != 0) {
      puVar4 = kj::ArrayPtr<const_unsigned_char>::operator[]
                         ((ArrayPtr<const_unsigned_char> *)&dataSizeL,dataR.size_ - 1);
      bVar5 = *puVar4 == '\0';
    }
    if (!bVar5) break;
    dataR.size_ = dataR.size_ - 1;
  }
  _dataSizeR = getDataSection(&right);
  ptrsL.reader._40_8_ =
       kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&dataSizeR);
  while( true ) {
    bVar5 = false;
    if (ptrsL.reader._40_8_ != 0) {
      puVar4 = kj::ArrayPtr<const_unsigned_char>::operator[]
                         ((ArrayPtr<const_unsigned_char> *)&dataSizeR,ptrsL.reader._40_8_ - 1);
      bVar5 = *puVar4 == '\0';
    }
    if (!bVar5) break;
    ptrsL.reader._40_8_ = ptrsL.reader._40_8_ + -1;
  }
  if (dataR.size_ == ptrsL.reader._40_8_) {
    puVar4 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&dataSizeL);
    __s2 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&dataSizeR);
    iVar1 = memcmp(puVar4,__s2,dataR.size_);
    if (iVar1 == 0) {
      getPointerSection((Reader *)&ptrsSizeL,this);
      uVar2 = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)&ptrsSizeL);
      local_80 = (ulong)uVar2;
      while( true ) {
        local_189 = false;
        if (local_80 != 0) {
          List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                    ((Reader *)&ptrsR.reader.nestingLimit,(Reader *)&ptrsSizeL,(int)local_80 - 1);
          local_189 = AnyPointer::Reader::isNull((Reader *)&ptrsR.reader.nestingLimit);
        }
        if (local_189 == false) break;
        local_80 = local_80 - 1;
      }
      getPointerSection((Reader *)&ptrsSizeR,&right);
      uVar2 = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)&ptrsSizeR);
      local_d8 = (ulong)uVar2;
      while( true ) {
        local_18a = false;
        if (local_d8 != 0) {
          List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                    ((Reader *)&i,(Reader *)&ptrsSizeR,(int)local_d8 - 1);
          local_18a = AnyPointer::Reader::isNull((Reader *)&i);
        }
        if (local_18a == false) break;
        local_d8 = local_d8 - 1;
      }
      if (local_80 == local_d8) {
        l.reader._28_4_ = 1;
        for (_uStack_100 = 0; _uStack_100 < local_80; _uStack_100 = _uStack_100 + 1) {
          __return_storage_ptr__ = &r.reader.nestingLimit;
          List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                    ((Reader *)__return_storage_ptr__,(Reader *)&ptrsSizeL,uStack_100);
          List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                    ((Reader *)auStack_148,(Reader *)&ptrsSizeR,uStack_100);
          right_00.reader.capTable = (CapTableReader *)r.reader.segment;
          right_00.reader.segment = (SegmentReader *)auStack_148;
          right_00.reader.pointer = (WirePointer *)r.reader.capTable;
          right_00.reader._24_8_ = r.reader.pointer;
          EVar3 = AnyPointer::Reader::equals((Reader *)__return_storage_ptr__,right_00);
          if (EVar3 == NOT_EQUAL) {
            return NOT_EQUAL;
          }
          if (EVar3 != EQUAL) {
            if (EVar3 != UNKNOWN_CONTAINS_CAPS) {
              kj::_::unreachable();
            }
            l.reader._28_4_ = 2;
          }
        }
        this_local._4_4_ = l.reader._28_4_;
      }
      else {
        this_local._4_4_ = NOT_EQUAL;
      }
    }
    else {
      this_local._4_4_ = NOT_EQUAL;
    }
  }
  else {
    this_local._4_4_ = NOT_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

Equality AnyStruct::Reader::equals(AnyStruct::Reader right) const {
  auto dataL = getDataSection();
  size_t dataSizeL = dataL.size();
  while(dataSizeL > 0 && dataL[dataSizeL - 1] == 0) {
    -- dataSizeL;
  }

  auto dataR = right.getDataSection();
  size_t dataSizeR = dataR.size();
  while(dataSizeR > 0 && dataR[dataSizeR - 1] == 0) {
    -- dataSizeR;
  }

  if(dataSizeL != dataSizeR) {
    return Equality::NOT_EQUAL;
  }

  if(0 != memcmp(dataL.begin(), dataR.begin(), dataSizeL)) {
    return Equality::NOT_EQUAL;
  }

  auto ptrsL = getPointerSection();
  size_t ptrsSizeL = ptrsL.size();
  while (ptrsSizeL > 0 && ptrsL[ptrsSizeL - 1].isNull()) {
    -- ptrsSizeL;
  }

  auto ptrsR = right.getPointerSection();
  size_t ptrsSizeR = ptrsR.size();
  while (ptrsSizeR > 0 && ptrsR[ptrsSizeR - 1].isNull()) {
    -- ptrsSizeR;
  }

  if(ptrsSizeL != ptrsSizeR) {
    return Equality::NOT_EQUAL;
  }

  size_t i = 0;

  auto eqResult = Equality::EQUAL;
  for (; i < ptrsSizeL; i++) {
    auto l = ptrsL[i];
    auto r = ptrsR[i];
    switch(l.equals(r)) {
      case Equality::EQUAL:
        break;
      case Equality::NOT_EQUAL:
        return Equality::NOT_EQUAL;
      case Equality::UNKNOWN_CONTAINS_CAPS:
        eqResult = Equality::UNKNOWN_CONTAINS_CAPS;
        break;
      default:
        KJ_UNREACHABLE;
    }
  }

  return eqResult;
}